

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512bw_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  uint uVar2;
  size_t i_1;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  int j;
  uint32_t uVar6;
  long lVar7;
  undefined1 (*pauVar8) [64];
  size_t z;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar38 [64];
  uint16_t buffer [32];
  __m512i counter [16];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  for (uVar2 = len & 0xfffffe00; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar1 = array[uVar2];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  auVar11 = vpbroadcastw_avx512bw(ZEXT216(1));
  auVar10 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar38 = ZEXT1664(auVar10);
  auVar37 = ZEXT1664((undefined1  [16])0x0);
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  auVar36 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0;
  uVar5 = (ulong)(len >> 5 & 0xfffffff0);
  while (uVar3 < uVar5) {
    for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      *(undefined8 *)(local_480 + lVar7) = 0;
      *(undefined8 *)(local_480 + lVar7 + 8) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x10) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x18) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x20) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x28) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x30) = 0;
      *(undefined8 *)(local_480 + lVar7 + 0x38) = 0;
    }
    auVar12 = vmovdqa64_avx512f(local_480);
    auVar13 = vmovdqa64_avx512f(local_440);
    auVar14 = vmovdqa64_avx512f(local_400);
    auVar15 = vmovdqa64_avx512f(local_3c0);
    auVar16 = vmovdqa64_avx512f(local_380);
    auVar17 = vmovdqa64_avx512f(local_340);
    auVar18 = vmovdqa64_avx512f(local_300);
    auVar19 = vmovdqa64_avx512f(local_2c0);
    auVar20 = vmovdqa64_avx512f(local_280);
    auVar21 = vmovdqa64_avx512f(local_240);
    auVar22 = vmovdqa64_avx512f(local_200);
    auVar23 = vmovdqa64_avx512f(local_1c0);
    auVar24 = vmovdqa64_avx512f(local_180);
    auVar25 = vmovdqa64_avx512f(local_140);
    auVar26 = vmovdqa64_avx512f(local_100);
    auVar27 = vmovdqa64_avx512f(local_c0);
    uVar4 = uVar3 + 0xffff;
    if (uVar5 - uVar3 < 0x10000) {
      uVar4 = uVar5;
    }
    pauVar8 = (undefined1 (*) [64])(array + uVar3 * 0x20 + 0x1e0);
    while (uVar3 < uVar4) {
      auVar28 = vmovdqu64_avx512f(pauVar8[-0xe]);
      auVar29 = vmovdqu64_avx512f(pauVar8[-0xf]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-0xd]);
      auVar31 = vmovdqu64_avx512f(pauVar8[-0xc]);
      auVar32 = vmovdqu64_avx512f(pauVar8[-8]);
      uVar3 = uVar3 + 0x10;
      auVar33 = vmovdqa64_avx512f(auVar28);
      auVar28 = vpternlogd_avx512f(auVar28,auVar29,auVar38,0x96);
      auVar38 = vpternlogd_avx512f(auVar33,auVar29,auVar38,0xe8);
      auVar29 = vmovdqa64_avx512f(auVar31);
      auVar29 = vpternlogd_avx512f(auVar29,auVar30,auVar28,0xe8);
      auVar28 = vpternlogd_avx512f(auVar28,auVar30,auVar31,0x96);
      auVar30 = vmovdqu64_avx512f(pauVar8[-10]);
      auVar31 = vmovdqa64_avx512f(auVar29);
      auVar31 = vpternlogd_avx512f(auVar31,auVar38,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar29,auVar38,auVar37,0x96);
      auVar38 = vmovdqu64_avx512f(pauVar8[-0xb]);
      auVar29 = vmovdqa64_avx512f(auVar32);
      auVar33 = vmovdqa64_avx512f(auVar30);
      auVar33 = vpternlogd_avx512f(auVar33,auVar38,auVar28,0xe8);
      auVar38 = vpternlogd_avx512f(auVar28,auVar38,auVar30,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-9]);
      auVar29 = vpternlogd_avx512f(auVar29,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar32,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-6]);
      auVar30 = vmovdqa64_avx512f(auVar29);
      auVar30 = vpternlogd_avx512f(auVar30,auVar33,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar29,auVar33,auVar37,0x96);
      auVar29 = vmovdqa64_avx512f(auVar30);
      auVar29 = vpternlogd_avx512f(auVar29,auVar31,auVar35,0xe8);
      auVar35 = vpternlogd_avx512f(auVar30,auVar31,auVar35,0x96);
      auVar30 = vmovdqu64_avx512f(pauVar8[-7]);
      auVar31 = vmovdqa64_avx512f(auVar28);
      auVar31 = vpternlogd_avx512f(auVar31,auVar30,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar30,auVar28,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-4]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-5]);
      auVar32 = vmovdqa64_avx512f(auVar28);
      auVar32 = vpternlogd_avx512f(auVar32,auVar30,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar30,auVar28,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-3]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-2]);
      auVar33 = vmovdqa64_avx512f(auVar32);
      auVar33 = vpternlogd_avx512f(auVar33,auVar31,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar32,auVar31,auVar37,0x96);
      auVar31 = vmovdqu64_avx512f(*pauVar8);
      auVar32 = vmovdqa64_avx512f(auVar30);
      auVar32 = vpternlogd_avx512f(auVar32,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar30,0x96);
      auVar28 = vmovdqu64_avx512f(pauVar8[-1]);
      pauVar8 = pauVar8 + 0x10;
      auVar30 = vmovdqa64_avx512f(auVar31);
      auVar30 = vpternlogd_avx512f(auVar30,auVar28,auVar38,0xe8);
      auVar38 = vpternlogd_avx512f(auVar38,auVar28,auVar31,0x96);
      auVar28 = vpsrlw_avx512bw(auVar36,1);
      auVar31 = vmovdqa64_avx512f(auVar30);
      auVar31 = vpternlogd_avx512f(auVar31,auVar32,auVar37,0xe8);
      auVar37 = vpternlogd_avx512f(auVar30,auVar32,auVar37,0x96);
      auVar30 = vpandq_avx512f(auVar36,auVar11);
      auVar32 = vmovdqa64_avx512f(auVar31);
      auVar12 = vpaddw_avx512bw(auVar12,auVar30);
      auVar30 = vpternlogd_avx512f(auVar32,auVar33,auVar35,0xe8);
      auVar35 = vpternlogd_avx512f(auVar31,auVar33,auVar35,0x96);
      auVar28 = vpandq_avx512f(auVar28,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,2);
      auVar32 = vpsrlw_avx512bw(auVar36,3);
      auVar13 = vpaddw_avx512bw(auVar13,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,4);
      auVar14 = vpaddw_avx512bw(auVar14,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,5);
      auVar15 = vpaddw_avx512bw(auVar15,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,6);
      auVar16 = vpaddw_avx512bw(auVar16,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,7);
      auVar17 = vpaddw_avx512bw(auVar17,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,8);
      auVar18 = vpaddw_avx512bw(auVar18,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,9);
      auVar19 = vpaddw_avx512bw(auVar19,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,10);
      auVar20 = vpaddw_avx512bw(auVar20,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,0xb);
      auVar21 = vpaddw_avx512bw(auVar21,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,0xc);
      auVar22 = vpaddw_avx512bw(auVar22,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar32 = vpsrlw_avx512bw(auVar36,0xd);
      auVar23 = vpaddw_avx512bw(auVar23,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar31 = vpsrlw_avx512bw(auVar36,0xe);
      auVar36 = vpsrlw_avx512bw(auVar36,0xf);
      auVar24 = vpaddw_avx512bw(auVar24,auVar28);
      auVar28 = vpandq_avx512f(auVar32,auVar11);
      auVar27 = vpaddw_avx512bw(auVar27,auVar36);
      auVar36 = vmovdqa64_avx512f(auVar30);
      auVar36 = vpternlogd_avx512f(auVar36,auVar29,auVar34,0xe8);
      auVar34 = vpternlogd_avx512f(auVar34,auVar29,auVar30,0x96);
      auVar38 = vmovdqa64_avx512f(auVar38);
      auVar25 = vpaddw_avx512bw(auVar25,auVar28);
      auVar28 = vpandq_avx512f(auVar31,auVar11);
      auVar26 = vpaddw_avx512bw(auVar26,auVar28);
    }
    local_440 = vmovdqa64_avx512f(auVar13);
    local_400 = vmovdqa64_avx512f(auVar14);
    local_3c0 = vmovdqa64_avx512f(auVar15);
    local_380 = vmovdqa64_avx512f(auVar16);
    local_340 = vmovdqa64_avx512f(auVar17);
    local_300 = vmovdqa64_avx512f(auVar18);
    local_2c0 = vmovdqa64_avx512f(auVar19);
    local_280 = vmovdqa64_avx512f(auVar20);
    local_240 = vmovdqa64_avx512f(auVar21);
    local_200 = vmovdqa64_avx512f(auVar22);
    local_1c0 = vmovdqa64_avx512f(auVar23);
    local_180 = vmovdqa64_avx512f(auVar24);
    local_140 = vmovdqa64_avx512f(auVar25);
    local_100 = vmovdqa64_avx512f(auVar26);
    local_c0 = vmovdqa64_avx512f(auVar27);
    lVar7 = 0;
    local_480 = vmovdqa64_avx512f(auVar12);
    for (; lVar7 != 0x400; lVar7 = lVar7 + 0x40) {
      auVar12 = vpandq_avx512f(auVar36,auVar11);
      auVar12 = vpaddw_avx512bw(auVar12,*(undefined1 (*) [64])(local_480 + lVar7));
      auVar36 = vpsrlw_avx512bw(auVar36,1);
      auVar12 = vmovdqa64_avx512f(auVar12);
      *(undefined1 (*) [64])(local_480 + lVar7) = auVar12;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      lVar9 = 0;
      auVar12 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_480 + lVar7 * 0x40));
      local_4c0 = vmovdqu64_avx512f(auVar12);
      uVar6 = flags[lVar7];
      for (; lVar9 != 0x20; lVar9 = lVar9 + 1) {
        uVar6 = uVar6 + (uint)*(ushort *)(local_4c0 + lVar9 * 2) * 0x10;
      }
      flags[lVar7] = uVar6;
    }
  }
  lVar7 = 0;
  local_4c0 = vmovdqu64_avx512f(auVar38);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uint)((uVar1 >> ((uint)lVar9 & 0x1f) & 1) != 0);
    }
  }
  lVar7 = 0;
  local_4c0 = vmovdqu64_avx512f(auVar37);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + ((uint)(uVar1 >> ((uint)lVar9 & 0x1f)) * 2 & 2);
    }
  }
  lVar7 = 0;
  local_4c0 = vmovdqu64_avx512f(auVar35);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 4;
    }
  }
  lVar7 = 0;
  local_4c0 = vmovdqu64_avx512f(auVar34);
  for (; lVar7 != 0x20; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_4c0 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 8;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;
    __m512i counter[16];

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        for (size_t i = 0; i < 16; ++i)
            counter[i] = _mm512_setzero_si512();

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA, &v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,   &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,   &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB,  &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB, &v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,     &v8, eightsA, eightsB);
        }
        // Update the counters after the last iteration.
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)buffer, counter[i]);
            for (size_t z = 0; z < 32; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; i++) {
        for (int j = 0; j < 16; j++) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}